

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O1

bool __thiscall Json::OurReader::decodeNumber(OurReader *this,Token *token,Value *decoded)

{
  char cVar1;
  byte bVar2;
  ulong uVar3;
  bool bVar4;
  bool bVar5;
  ulong *puVar6;
  ulong uVar7;
  ulong uVar8;
  ulong value;
  byte *pbVar9;
  Value *this_00;
  Value local_a8;
  Value local_80;
  Value local_58;
  
  cVar1 = *token->start_;
  if (cVar1 == '-') {
    puVar6 = &Value::minLargestInt;
  }
  else {
    puVar6 = &Value::maxLargestUInt;
  }
  pbVar9 = (byte *)(token->start_ + (cVar1 == '-'));
  uVar3 = *puVar6;
  uVar8 = uVar3 / 10;
  bVar5 = false;
  value = 0;
  do {
    if (token->end_ <= pbVar9) {
      if (cVar1 == '-') {
        this_00 = &local_58;
        Value::Value(this_00,-value);
        Value::operator=(decoded,this_00);
      }
      else if (value < 0x80000000) {
        this_00 = &local_80;
        Value::Value(this_00,value);
        Value::operator=(decoded,this_00);
      }
      else {
        this_00 = &local_a8;
        Value::Value(this_00,value);
        Value::operator=(decoded,this_00);
      }
      Value::~Value(this_00);
      return true;
    }
    bVar2 = *pbVar9;
    pbVar9 = pbVar9 + 1;
    if (((byte)(bVar2 - 0x3a) < 0xf6) ||
       ((uVar7 = (ulong)(bVar2 - 0x30), uVar8 <= value &&
        (((uVar8 < value || (pbVar9 != (byte *)token->end_)) || (uVar3 % 10 < uVar7)))))) {
      bVar5 = decodeDouble(this,token,decoded);
      bVar4 = false;
    }
    else {
      value = uVar7 + value * 10;
      bVar4 = true;
    }
  } while (bVar4);
  return bVar5;
}

Assistant:

bool OurReader::decodeNumber(Token& token, Value& decoded) {
  // Attempts to parse the number as an integer. If the number is
  // larger than the maximum supported value of an integer then
  // we decode the number as a double.
  Location current = token.start_;
  bool isNegative = *current == '-';
  if (isNegative)
    ++current;
  // TODO: Help the compiler do the div and mod at compile time or get rid of them.
  Value::LargestUInt maxIntegerValue =
      isNegative ? Value::LargestUInt(Value::minLargestInt)
                 : Value::maxLargestUInt;
  Value::LargestUInt threshold = maxIntegerValue / 10;
  Value::LargestUInt value = 0;
  while (current < token.end_) {
    Char c = *current++;
    if (c < '0' || c > '9')
      return decodeDouble(token, decoded);
    Value::UInt digit(static_cast<Value::UInt>(c - '0'));
    if (value >= threshold) {
      // We've hit or exceeded the max value divided by 10 (rounded down). If
      // a) we've only just touched the limit, b) this is the last digit, and
      // c) it's small enough to fit in that rounding delta, we're okay.
      // Otherwise treat this number as a double to avoid overflow.
      if (value > threshold || current != token.end_ ||
          digit > maxIntegerValue % 10) {
        return decodeDouble(token, decoded);
      }
    }
    value = value * 10 + digit;
  }
  if (isNegative)
    decoded = -Value::LargestInt(value);
  else if (value <= Value::LargestUInt(Value::maxInt))
    decoded = Value::LargestInt(value);
  else
    decoded = value;
  return true;
}